

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::RequestBuilder::~RequestBuilder(RequestBuilder *this)

{
  std::_Function_base::~_Function_base(&(this->completion_).super__Function_base);
  std::__cxx11::string::~string((string *)&this->url_);
  std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::~unique_ptr
            (&this->options_);
  std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::~unique_ptr
            (&this->request_);
  return;
}

Assistant:

~RequestBuilder() {
        }